

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_pckev_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 0xf) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 0xd) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar3 + 10);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 0xb) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar3 + 6);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 9) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar3 + 2);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 7) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar2 + 0xe);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 5) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar2 + 10);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 3) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar2 + 6);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 1) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar2 + 2);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 0xe) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 10) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar3 + 4);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 6) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar2 + 0xc);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 2) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar2 + 4);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 0xc) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar3 + 8);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 4) =
       *(undefined1 *)((long)(env->active_fpu).fpr + lVar2 + 8);
  *(undefined1 *)((long)(env->active_fpu).fpr + lVar1 + 8) =
       *(undefined1 *)((env->active_fpu).fpr + ws);
  *(undefined1 *)((env->active_fpu).fpr + wd) = *(undefined1 *)((env->active_fpu).fpr + wt);
  return;
}

Assistant:

void helper_msa_pckev_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

#if defined(HOST_WORDS_BIGENDIAN)
    pwd->b[8]  = pws->b[9];
    pwd->b[10] = pws->b[13];
    pwd->b[12] = pws->b[1];
    pwd->b[14] = pws->b[5];
    pwd->b[0]  = pwt->b[9];
    pwd->b[2]  = pwt->b[13];
    pwd->b[4]  = pwt->b[1];
    pwd->b[6]  = pwt->b[5];
    pwd->b[9]  = pws->b[11];
    pwd->b[13] = pws->b[3];
    pwd->b[1]  = pwt->b[11];
    pwd->b[5]  = pwt->b[3];
    pwd->b[11] = pws->b[15];
    pwd->b[3]  = pwt->b[15];
    pwd->b[15] = pws->b[7];
    pwd->b[7]  = pwt->b[7];
#else
    pwd->b[15] = pws->b[14];
    pwd->b[13] = pws->b[10];
    pwd->b[11] = pws->b[6];
    pwd->b[9]  = pws->b[2];
    pwd->b[7]  = pwt->b[14];
    pwd->b[5]  = pwt->b[10];
    pwd->b[3]  = pwt->b[6];
    pwd->b[1]  = pwt->b[2];
    pwd->b[14] = pws->b[12];
    pwd->b[10] = pws->b[4];
    pwd->b[6]  = pwt->b[12];
    pwd->b[2]  = pwt->b[4];
    pwd->b[12] = pws->b[8];
    pwd->b[4]  = pwt->b[8];
    pwd->b[8]  = pws->b[0];
    pwd->b[0]  = pwt->b[0];
#endif
}